

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1316c99::HandleRPathRemoveCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  KeywordNameAction *pKVar1;
  bool bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pbVar5;
  static_string_view name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  bool removed;
  string file;
  cmFileTimes ft;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string emsg;
  string message;
  ParseResult parseResult;
  cmArgumentParser<void> parser;
  bool local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  cmFileTimes local_1c8;
  undefined1 local_1c0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string local_168;
  string local_148;
  undefined1 local_128 [24];
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined8 local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  ParseResult local_c8;
  cmArgumentParser<void> local_98;
  
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name.super_string_view._M_str = "FILE";
  name.super_string_view._M_len = 4;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&local_98,name,&local_1e8);
  local_128._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_128._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  cmArgumentParser<void>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_c8,&local_98,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_128,&local_188,0);
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = ArgumentParser::ParseResult::MaybeReportError(&local_c8,status->Makefile);
    bVar3 = true;
    if (bVar2) goto LAB_003b9c04;
    if (local_1e8._M_string_length != 0) {
      bVar2 = cmsys::SystemTools::FileExists(&local_1e8,true);
      if (bVar2) {
        cmFileTimes::cmFileTimes(&local_1c8,&local_1e8);
        local_168._M_string_length = 0;
        local_168.field_2._M_local_buf[0] = '\0';
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        bVar3 = cmSystemTools::RemoveRPath(&local_1e8,&local_168,&local_1e9);
        if (bVar3) {
          if (local_1e9 == true) {
            local_128._0_8_ = (pointer)0x1b;
            local_128._8_8_ = "Removed runtime path from \"";
            local_128._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_110 = local_1e8._M_string_length;
            local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._M_dataplus._M_p;
            local_100 = 0;
            local_1c0._16_8_ = &local_1a8;
            local_1c0._0_8_ = (pointer)0x0;
            local_1c0._8_8_ = 1;
            local_1a8._M_dataplus._M_p._0_1_ = '\"';
            local_f8 = 1;
            local_e8 = 0;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_128;
            local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0._16_8_;
            cmCatViews(&local_148,views_00);
            cmMakefile::DisplayStatus(status->Makefile,&local_148,-1.0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
          cmFileTimes::Store(&local_1c8,&local_1e8);
        }
        else {
          local_128._0_8_ = (pointer)0x32;
          local_128._8_8_ = "RPATH_REMOVE could not remove RPATH from file: \n  ";
          local_128._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_110 = local_1e8._M_string_length;
          local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p;
          local_100 = 0;
          local_f8 = 1;
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8c8cfe;
          local_e8 = 0;
          local_e0 = local_168._M_string_length;
          local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_168._M_dataplus._M_p;
          local_d0 = 0;
          views_02._M_len = 4;
          views_02._M_array = (iterator)local_128;
          cmCatViews((string *)local_1c0,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((pointer)local_1c0._0_8_ != (pointer)(local_1c0 + 0x10)) {
            operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        cmFileTimes::~cmFileTimes(&local_1c8);
        goto LAB_003b9c04;
      }
      local_128._0_8_ = &DAT_00000019;
      local_128._8_8_ = "RPATH_REMOVE given FILE \"";
      local_128._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_110 = local_1e8._M_string_length;
      local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p;
      local_100 = 0;
      local_f8 = 0x16;
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8ad637;
      local_e8 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_128;
      cmCatViews((string *)local_1c0,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_003b9be7;
    }
    local_128._0_8_ = (pointer)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"RPATH_REMOVE not given FILE option.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._16_8_;
    pbVar5 = (pointer)local_128._0_8_;
    if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) goto LAB_003b9bfa;
  }
  else {
    local_128._0_8_ = (pointer)0x24;
    local_128._8_8_ = "RPATH_REMOVE given unknown argument ";
    local_128._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_110 = (local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_100 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_128;
    cmCatViews((string *)local_1c0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003b9be7:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._16_8_;
    pbVar5 = (pointer)local_1c0._0_8_;
    if ((pointer)local_1c0._0_8_ != (pointer)(local_1c0 + 0x10)) {
LAB_003b9bfa:
      operator_delete(pbVar5,(ulong)((long)&(pbVar4->_M_dataplus)._M_p + 1));
    }
  }
  bVar3 = false;
LAB_003b9c04:
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_98.super_Base.Bindings.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.ParsedKeyword;
    (*local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  if (local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.KeywordMissingValue;
    (*local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool HandleRPathRemoveCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  // Evaluate arguments.
  std::string file;
  cmArgumentParser<void> parser;
  std::vector<std::string> unknownArgs;
  parser.Bind("FILE"_s, file);
  ArgumentParser::ParseResult parseResult =
    parser.Parse(cmMakeRange(args).advance(1), &unknownArgs);
  if (!unknownArgs.empty()) {
    status.SetError(
      cmStrCat("RPATH_REMOVE given unknown argument ", unknownArgs.front()));
    return false;
  }
  if (parseResult.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if (file.empty()) {
    status.SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    status.SetError(
      cmStrCat("RPATH_REMOVE given FILE \"", file, "\" that does not exist."));
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    status.SetError(
      cmStrCat("RPATH_REMOVE could not remove RPATH from file: \n  ", file,
               "\n", emsg));
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message =
        cmStrCat("Removed runtime path from \"", file, '"');
      status.GetMakefile().DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}